

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O0

fields absl::time_internal::cctz::detail::impl::n_min
                 (year_t y,diff_t m,diff_t d,diff_t hh,diff_t ch,diff_t mm,second_t ss)

{
  undefined1 auVar1 [13];
  long lVar2;
  long lVar3;
  fields fVar4;
  undefined8 local_48;
  diff_t mm_local;
  diff_t ch_local;
  diff_t hh_local;
  diff_t d_local;
  diff_t m_local;
  year_t y_local;
  undefined3 uStack_b;
  
  mm_local = mm / 0x3c + ch;
  local_48 = mm % 0x3c;
  if (local_48 < 0) {
    mm_local = mm_local + -1;
    local_48 = local_48 + 0x3c;
  }
  lVar3 = (hh / 6 + (hh >> 0x3f) >> 2) - (hh >> 0x3f);
  lVar2 = (mm_local / 6 + (mm_local >> 0x3f) >> 2) - (mm_local >> 0x3f);
  fVar4 = n_hour(y,m,d,lVar3 + lVar2,hh + lVar3 * -0x18 + mm_local + lVar2 * -0x18,
                 (minute_t)local_48,ss);
  auVar1 = fVar4._0_13_;
  fVar4._13_3_ = uStack_b;
  fVar4.y = auVar1._0_8_;
  fVar4.m = auVar1[8];
  fVar4.d = auVar1[9];
  fVar4.hh = auVar1[10];
  fVar4.mm = auVar1[0xb];
  fVar4.ss = auVar1[0xc];
  return fVar4;
}

Assistant:

CONSTEXPR_F fields n_min(year_t y, diff_t m, diff_t d, diff_t hh, diff_t ch,
                         diff_t mm, second_t ss) noexcept {
  ch += mm / 60;
  mm %= 60;
  if (mm < 0) {
    ch -= 1;
    mm += 60;
  }
  return n_hour(y, m, d, hh / 24 + ch / 24, hh % 24 + ch % 24,
                static_cast<minute_t>(mm), ss);
}